

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalUpdateCounts(Fts3Expr *pExpr,int nCol)

{
  int iVar1;
  int local_3c;
  int local_38;
  byte local_31;
  int iCnt;
  u8 c;
  char *p;
  Fts3Phrase *pFStack_20;
  int iCol;
  Fts3Phrase *pPhrase;
  Fts3Expr *pFStack_10;
  int nCol_local;
  Fts3Expr *pExpr_local;
  
  if (pExpr != (Fts3Expr *)0x0) {
    pFStack_20 = pExpr->pPhrase;
    pPhrase._4_4_ = nCol;
    pFStack_10 = pExpr;
    if ((pFStack_20 != (Fts3Phrase *)0x0) && ((pFStack_20->doclist).pList != (char *)0x0)) {
      p._4_4_ = 0;
      _iCnt = (byte *)(pFStack_20->doclist).pList;
      do {
        local_31 = 0;
        local_38 = 0;
        for (; (*_iCnt & 0xfe) != 0 || local_31 != 0; _iCnt = _iCnt + 1) {
          if (local_31 == 0) {
            local_38 = local_38 + 1;
          }
          local_31 = *_iCnt & 0x80;
        }
        iVar1 = p._4_4_ * 3 + 1;
        pFStack_10->aMI[iVar1] = local_38 + pFStack_10->aMI[iVar1];
        iVar1 = p._4_4_ * 3 + 2;
        pFStack_10->aMI[iVar1] = (uint)(0 < local_38) + pFStack_10->aMI[iVar1];
        if (*_iCnt == 0) break;
        _iCnt = _iCnt + 1;
        if ((*_iCnt & 0x80) == 0) {
          p._4_4_ = (uint)*_iCnt;
          local_3c = 1;
        }
        else {
          local_3c = sqlite3Fts3GetVarint32((char *)_iCnt,(int *)((long)&p + 4));
        }
        _iCnt = _iCnt + local_3c;
      } while ((int)p._4_4_ < pPhrase._4_4_);
    }
    fts3EvalUpdateCounts(pFStack_10->pLeft,pPhrase._4_4_);
    fts3EvalUpdateCounts(pFStack_10->pRight,pPhrase._4_4_);
  }
  return;
}

Assistant:

static void fts3EvalUpdateCounts(Fts3Expr *pExpr, int nCol){
  if( pExpr ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;
    if( pPhrase && pPhrase->doclist.pList ){
      int iCol = 0;
      char *p = pPhrase->doclist.pList;

      do{
        u8 c = 0;
        int iCnt = 0;
        while( 0xFE & (*p | c) ){
          if( (c&0x80)==0 ) iCnt++;
          c = *p++ & 0x80;
        }

        /* aMI[iCol*3 + 1] = Number of occurrences
        ** aMI[iCol*3 + 2] = Number of rows containing at least one instance
        */
        pExpr->aMI[iCol*3 + 1] += iCnt;
        pExpr->aMI[iCol*3 + 2] += (iCnt>0);
        if( *p==0x00 ) break;
        p++;
        p += fts3GetVarint32(p, &iCol);
      }while( iCol<nCol );
    }

    fts3EvalUpdateCounts(pExpr->pLeft, nCol);
    fts3EvalUpdateCounts(pExpr->pRight, nCol);
  }
}